

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidValue(ApiErrorsTest *this,bool *result)

{
  GLuint GVar1;
  GLuint GVar2;
  GLenum err;
  GLdouble vector [4];
  GLdouble local_48 [4];
  
  (*(this->super_Base).gl.getIntegerv)(0x8869,(GLint *)local_48);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb9);
  GVar2 = local_48[0]._0_4_;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  (*(this->super_Base).gl.vertexAttribL1d)(GVar2,0.0);
  verifyError(this,0x501,"VertexAttribL1d(GL_MAX_VERTEX_ATTRIBS, ...)",0x1db,result);
  GVar1 = GVar2 + 1;
  (*(this->super_Base).gl.vertexAttribL1d)(GVar1,0.0);
  verifyError(this,0x501,"VertexAttribL1d(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1de,result);
  (*(this->super_Base).gl.vertexAttribL2d)(GVar2,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL2d(GL_MAX_VERTEX_ATTRIBS, ...)",0x1e1,result);
  (*(this->super_Base).gl.vertexAttribL2d)(GVar1,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL2d(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1e4,result);
  (*(this->super_Base).gl.vertexAttribL3d)(GVar2,0.0,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL3d(GL_MAX_VERTEX_ATTRIBS, ...)",0x1e7,result);
  (*(this->super_Base).gl.vertexAttribL3d)(GVar1,0.0,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL3d(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1ea,result);
  (*(this->super_Base).gl.vertexAttribL4d)(GVar2,0.0,0.0,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL4d(GL_MAX_VERTEX_ATTRIBS, ...)",0x1ed,result);
  (*(this->super_Base).gl.vertexAttribL4d)(GVar1,0.0,0.0,0.0,0.0);
  verifyError(this,0x501,"VertexAttribL4d(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1f0,result);
  (*(this->super_Base).gl.vertexAttribL1dv)(GVar2,local_48);
  verifyError(this,0x501,"VertexAttribL1dv(GL_MAX_VERTEX_ATTRIBS, ...)",499,result);
  (*(this->super_Base).gl.vertexAttribL1dv)(GVar1,local_48);
  verifyError(this,0x501,"VertexAttribL1dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1f6,result);
  (*(this->super_Base).gl.vertexAttribL2dv)(GVar2,local_48);
  verifyError(this,0x501,"VertexAttribL2dv(GL_MAX_VERTEX_ATTRIBS, ...)",0x1f9,result);
  (*(this->super_Base).gl.vertexAttribL2dv)(GVar1,local_48);
  verifyError(this,0x501,"VertexAttribL2dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x1fc,result);
  (*(this->super_Base).gl.vertexAttribL3dv)(GVar2,local_48);
  verifyError(this,0x501,"VertexAttribL3dv(GL_MAX_VERTEX_ATTRIBS, ...)",0x1ff,result);
  (*(this->super_Base).gl.vertexAttribL3dv)(GVar1,local_48);
  verifyError(this,0x501,"VertexAttribL3dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x202,result);
  (*(this->super_Base).gl.vertexAttribL4dv)(GVar2,local_48);
  verifyError(this,0x501,"VertexAttribL4dv(GL_MAX_VERTEX_ATTRIBS, ...)",0x205,result);
  (*(this->super_Base).gl.vertexAttribL4dv)(GVar1,local_48);
  verifyError(this,0x501,"VertexAttribL4dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x208,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(GVar2,4,0x140a,0,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(GL_MAX_VERTEX_ATTRIBS, ...)",0x20b,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(GVar1,4,0x140a,0,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(GL_MAX_VERTEX_ATTRIBS + 1, ...)",0x20e,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(1,0,0x140a,0,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(..., 0 /* size */, ...)",0x215,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(1,5,0x140a,0,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(..., 5 /* size */, ...)",0x218,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,-1,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(..., -1 /* stride */, ...)",0x21f,result);
  (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,-4,(void *)0x0);
  verifyError(this,0x501,"VertexAttribLPointer(..., -4 /* stride */, ...)",0x222,result);
  return;
}

Assistant:

void ApiErrorsTest::invalidValue(bool& result)
{
	GLint		   max_vertex_attribs = GetMaxVertexAttribs();
	const GLdouble vector[4]		  = { 0.0, 0.0, 0.0, 0.0 };

	/*
	 * a) GL_INVALID_VALUE should be generated by:
	 *    I.    glVertexAttribL1d     ()
	 *    II.   glVertexAttribL2d     ()
	 *    III.  glVertexAttribL3d     ()
	 *    IV.   glVertexAttribL4d     ()
	 *    V.    glVertexAttribL1dv    ()
	 *    VI.   glVertexAttribL2dv    ()
	 *    VII.  glVertexAttribL3dv    ()
	 *    VIII. glVertexAttribL4dv    ()
	 *    IX.   glVertexAttribLPointer()
	 *
	 *    if <index> is greater than or equal to GL_MAX_VERTEX_ATTRIBS;
	 */
	gl.vertexAttribL1d(max_vertex_attribs, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL1d(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL1d(max_vertex_attribs + 1, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL1d(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL2d(max_vertex_attribs, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL2d(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL2d(max_vertex_attribs + 1, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL2d(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL3d(max_vertex_attribs, 0.0, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL3d(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL3d(max_vertex_attribs + 1, 0.0, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL3d(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL4d(max_vertex_attribs, 0.0, 0.0, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL4d(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL4d(max_vertex_attribs + 1, 0.0, 0.0, 0.0, 0.0);
	verifyError(GL_INVALID_VALUE, "VertexAttribL4d(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL1dv(max_vertex_attribs, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL1dv(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL1dv(max_vertex_attribs + 1, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL1dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL2dv(max_vertex_attribs, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL2dv(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL2dv(max_vertex_attribs + 1, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL2dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL3dv(max_vertex_attribs, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL3dv(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL3dv(max_vertex_attribs + 1, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL3dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribL4dv(max_vertex_attribs, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL4dv(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribL4dv(max_vertex_attribs + 1, vector);
	verifyError(GL_INVALID_VALUE, "VertexAttribL4dv(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	gl.vertexAttribLPointer(max_vertex_attribs, 4 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(GL_MAX_VERTEX_ATTRIBS, ...)", __LINE__, result);

	gl.vertexAttribLPointer(max_vertex_attribs + 1, 4 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(GL_MAX_VERTEX_ATTRIBS + 1, ...)", __LINE__, result);

	/*
	 *c) GL_INVALID_VALUE should be generated by glVertexAttribLPointer()
	 *if <size> is not 1, 2, 3 or 4.
	 */
	gl.vertexAttribLPointer(1, 0 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(..., 0 /* size */, ...)", __LINE__, result);

	gl.vertexAttribLPointer(1, 5 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(..., 5 /* size */, ...)", __LINE__, result);

	/*
	 *d) GL_INVALID_VALUE should be generated by glVertexAttribLPointer()
	 *   if <stride> is negative.
	 */
	gl.vertexAttribLPointer(1, 4 /*size */, GL_DOUBLE, -1 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(..., -1 /* stride */, ...)", __LINE__, result);

	gl.vertexAttribLPointer(1, 4 /*size */, GL_DOUBLE, -4 /* stride */, 0 /* pointer */);
	verifyError(GL_INVALID_VALUE, "VertexAttribLPointer(..., -4 /* stride */, ...)", __LINE__, result);
}